

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

void * mmap_alloc(mstate m,size_t nb)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  ulong *puVar5;
  ulong local_58;
  mchunkptr p;
  size_t psize;
  size_t offset;
  char *mm;
  size_t fp;
  size_t mmsize;
  size_t nb_local;
  mstate m_local;
  
  uVar1 = nb + mparams.page_size + 0x3e & (mparams.page_size - 1 ^ 0xffffffffffffffff);
  if ((m->footprint_limit == 0) ||
     ((uVar2 = m->footprint + uVar1, m->footprint < uVar2 && (uVar2 <= m->footprint_limit)))) {
    if ((nb < uVar1) &&
       (pcVar3 = (char *)mmap((void *)0x0,uVar1,3,0x22,-1,0), pcVar3 != (char *)0xffffffffffffffff))
    {
      if (((ulong)(pcVar3 + 0x10) & 0xf) == 0) {
        local_58 = 0;
      }
      else {
        local_58 = 0x10 - ((ulong)(pcVar3 + 0x10) & 0xf) & 0xf;
      }
      lVar4 = uVar1 - local_58;
      puVar5 = (ulong *)(pcVar3 + local_58);
      *puVar5 = local_58;
      puVar5[1] = lVar4 - 0x20;
      *(undefined8 *)((long)puVar5 + lVar4 + -0x18) = 0xb;
      *(undefined8 *)((long)puVar5 + lVar4 + -0x10) = 0;
      if ((m->least_addr == (char *)0x0) || (pcVar3 < m->least_addr)) {
        m->least_addr = pcVar3;
      }
      uVar1 = uVar1 + m->footprint;
      m->footprint = uVar1;
      if (m->max_footprint < uVar1) {
        m->max_footprint = m->footprint;
      }
      m_local = (mstate)(puVar5 + 2);
    }
    else {
      m_local = (mstate)0x0;
    }
  }
  else {
    m_local = (mstate)0x0;
  }
  return m_local;
}

Assistant:

static void* mmap_alloc(mstate m, size_t nb) {
  size_t mmsize = mmap_align(nb + SIX_SIZE_T_SIZES + CHUNK_ALIGN_MASK);
  if (m->footprint_limit != 0) {
    size_t fp = m->footprint + mmsize;
    if (fp <= m->footprint || fp > m->footprint_limit)
      return 0;
  }
  if (mmsize > nb) {     /* Check for wrap around 0 */
    char* mm = (char*)(CALL_DIRECT_MMAP(mmsize));
    if (mm != CMFAIL) {
      size_t offset = align_offset(chunk2mem(mm));
      size_t psize = mmsize - offset - MMAP_FOOT_PAD;
      mchunkptr p = (mchunkptr)(mm + offset);
      p->prev_foot = offset;
      p->head = psize;
      mark_inuse_foot(m, p, psize);
      chunk_plus_offset(p, psize)->head = FENCEPOST_HEAD;
      chunk_plus_offset(p, psize+SIZE_T_SIZE)->head = 0;

      if (m->least_addr == 0 || mm < m->least_addr)
        m->least_addr = mm;
      if ((m->footprint += mmsize) > m->max_footprint)
        m->max_footprint = m->footprint;
      assert(is_aligned(chunk2mem(p)));
      check_mmapped_chunk(m, p);
      return chunk2mem(p);
    }
  }
  return 0;
}